

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O1

istream * operator>>(istream *in,Point *p)

{
  istream *piVar1;
  Point local_20;
  
  piVar1 = std::istream::_M_extract<float>((float *)in);
  std::istream::_M_extract<float>((float *)piVar1);
  if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) != 0) {
    Point::Point(&local_20,0.0,0.0);
    *p = local_20;
  }
  return in;
}

Assistant:

istream& operator>>(istream& in, Point& p)
{
    in >> p._x >> p._y;
    if (!in) {
        p = Point();  // input failed, reset object to default state
    }
    return in;
}